

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forwarder.cpp
# Opt level: O2

void cppcms::forward_connection(shared_ptr<cppcms::http::context> *con,string *ip,int port)

{
  int iVar1;
  connection *pcVar2;
  undefined4 extraout_var;
  request *this;
  tcp_pipe *this_00;
  pair<void_*,_unsigned_long> pVar3;
  shared_ptr<cppcms::impl::tcp_pipe> pipe;
  string header;
  tcp_pipe *local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50;
  
  pcVar2 = http::context::connection
                     ((con->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
  iVar1 = (*pcVar2->_vptr_connection[2])(pcVar2);
  this = http::context::request
                   ((con->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
  pVar3 = http::request::raw_post_data(this);
  impl::make_scgi_header
            (&local_50,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)CONCAT44(extraout_var,iVar1),pVar3.second);
  std::__cxx11::string::append((char *)&local_50,(ulong)pVar3.first);
  this_00 = (tcp_pipe *)operator_new(0xb0);
  std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,&con->super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>);
  impl::tcp_pipe::tcp_pipe(this_00,(shared_ptr<cppcms::http::context> *)&local_60,ip,port);
  std::__shared_ptr<cppcms::impl::tcp_pipe,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::tcp_pipe,void>
            ((__shared_ptr<cppcms::impl::tcp_pipe,(__gnu_cxx::_Lock_policy)2> *)&local_70,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  impl::tcp_pipe::async_send_receive(local_70,&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void forward_connection(booster::shared_ptr<http::context> con,std::string const &ip,int port)
	{

		std::map<std::string,std::string> const &env = con->connection().getenv();
		std::pair<void *,size_t> post = con->request().raw_post_data();
		std::string header = impl::make_scgi_header(env,post.second);
		header.append(reinterpret_cast<char *>(post.first),post.second);
		
		booster::shared_ptr<impl::tcp_pipe> pipe(new impl::tcp_pipe(con,ip,port));
		pipe->async_send_receive(header);
	}